

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# musashi_softfloat.c
# Opt level: O0

float64 float64_add(float64 a,float64 b)

{
  flag zSign;
  flag fVar1;
  flag bSign;
  flag aSign;
  float64 b_local;
  float64 a_local;
  
  zSign = extractFloat64Sign(a);
  fVar1 = extractFloat64Sign(b);
  if (zSign == fVar1) {
    a_local = addFloat64Sigs(a,b,zSign);
  }
  else {
    a_local = subFloat64Sigs(a,b,zSign);
  }
  return a_local;
}

Assistant:

float64 float64_add( float64 a, float64 b )
{
	flag aSign, bSign;

	aSign = extractFloat64Sign( a );
	bSign = extractFloat64Sign( b );
	if ( aSign == bSign ) {
		return addFloat64Sigs( a, b, aSign );
	}
	else {
		return subFloat64Sigs( a, b, aSign );
	}

}